

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O0

int nghttp2_session_on_window_update_received(nghttp2_session *session,nghttp2_frame *frame)

{
  nghttp2_frame *frame_local;
  nghttp2_session *session_local;
  
  if ((frame->hd).stream_id == 0) {
    session_local._4_4_ = session_on_connection_window_update_received(session,frame);
  }
  else {
    session_local._4_4_ = session_on_stream_window_update_received(session,frame);
  }
  return session_local._4_4_;
}

Assistant:

int nghttp2_session_on_window_update_received(nghttp2_session *session,
                                              nghttp2_frame *frame) {
  if (frame->hd.stream_id == 0) {
    return session_on_connection_window_update_received(session, frame);
  } else {
    return session_on_stream_window_update_received(session, frame);
  }
}